

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void __thiscall bpptr::incwch(bpptr *this)

{
  long *in_RDI;
  size_t clen;
  size_t local_10;
  
  if (in_RDI[1] != 0) {
    local_10 = utf8_ptr::s_charsize(*(char *)*in_RDI);
    if ((ulong)in_RDI[1] < local_10) {
      local_10 = in_RDI[1];
    }
    *in_RDI = local_10 + *in_RDI;
    in_RDI[1] = in_RDI[1] - local_10;
  }
  return;
}

Assistant:

void incwch()
    {
        if (len != 0)
        {
            size_t clen = utf8_ptr::s_charsize(*p);
            if (clen > len)
                clen = len;
            p += clen;
            len -= clen;
        }
    }